

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::
ExtractShaders<Diligent::ShaderGLImpl,Diligent::GraphicsPipelineStateCreateInfo,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this,
          GraphicsPipelineStateCreateInfo *PSOCreateInfo,
          vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *ShaderStages,
          bool WaitUntilShadersReady)

{
  PIPELINE_TYPE PVar1;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  bool WaitUntilShadersReady_local;
  vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *ShaderStages_local;
  GraphicsPipelineStateCreateInfo *PSOCreateInfo_local;
  PipelineStateBase<Diligent::EngineGLImplTraits> *this_local;
  
  PVar1 = (PSOCreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  msg.field_2._M_local_buf[0xf] = WaitUntilShadersReady;
  if ((this->
      super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
      ).m_Desc.PipelineType != PVar1) {
    FormatString<char[26],char[64]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.PipelineType == PSOCreateInfo.PSODesc.PipelineType",
               (char (*) [64])(ulong)PVar1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x3ae);
    std::__cxx11::string::~string((string *)local_48);
  }
  PipelineStateUtils::
  ExtractShaders<Diligent::ShaderGLImpl,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
            (PSOCreateInfo,ShaderStages,(bool)(msg.field_2._M_local_buf[0xf] & 1),
             &this->m_ActiveShaderStages);
  return;
}

Assistant:

void ExtractShaders(const PSOCreateInfoType& PSOCreateInfo,
                        TShaderStages&           ShaderStages,
                        bool                     WaitUntilShadersReady = false)
    {
        VERIFY_EXPR(this->m_Desc.PipelineType == PSOCreateInfo.PSODesc.PipelineType);
        PipelineStateUtils::ExtractShaders<ShaderImplType>(PSOCreateInfo, ShaderStages, WaitUntilShadersReady, m_ActiveShaderStages);
    }